

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execAddiRg<(moira::Instr)120,(moira::Mode)0,(moira::Size)4>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  uint op1;
  ushort in_SI;
  u32 *in_RDI;
  u32 result;
  u32 data;
  u32 ea;
  int dst;
  u32 src;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  u32 in_stack_ffffffffffffffe8;
  undefined2 in_stack_fffffffffffffff4;
  
  uVar2 = readI<(moira::Size)4>
                    ((Moira *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  op1 = in_SI & 7;
  bVar1 = readOp<(moira::Mode)0,(moira::Size)4,0ul>
                    ((Moira *)CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,uVar2)),op1,
                     (u32 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
  if (bVar1) {
    uVar2 = addsub<(moira::Instr)120,(moira::Size)4>
                      ((Moira *)CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,uVar2)),op1,
                       in_stack_ffffffffffffffe8);
    prefetch<4ul>((Moira *)CONCAT44(in_stack_ffffffffffffffe4,uVar2));
    (**(code **)(*(long *)in_RDI + 200))(in_RDI,4);
    writeD<(moira::Size)4>
              ((Moira *)CONCAT44(in_stack_ffffffffffffffe4,uVar2),(int)((ulong)in_RDI >> 0x20),
               (u32)in_RDI);
  }
  return;
}

Assistant:

void
Moira::execAddiRg(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 ea, data, result;
    if (!readOp<M,S>(dst, ea, data)) return;

    result = addsub<I,S>(src, data);
    prefetch<POLLIPL>();

    if (S == Long) sync(4);
    writeD<S>(dst, result);
}